

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

QSize __thiscall QDockAreaLayoutInfo::size(QDockAreaLayoutInfo *this)

{
  long lVar1;
  bool bVar2;
  QSize *in_RDI;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffffd8;
  QSize in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = isEmpty((QDockAreaLayoutInfo *)0x56de5a);
  if (bVar2) {
    QSize::QSize(in_RDI,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                 (int)in_stack_ffffffffffffffd8);
  }
  else {
    in_stack_fffffffffffffff0 = QRect::size((QRect *)in_stack_fffffffffffffff0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_stack_fffffffffffffff0;
  }
  __stack_chk_fail();
}

Assistant:

QSize QDockAreaLayoutInfo::size() const
{
    return isEmpty() ? QSize(0, 0) : rect.size();
}